

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

uint Abc_TtCanonicizePhase(word *pTruth,int nVars)

{
  word wVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  int w;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  word *pLimit;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  word *pwVar18;
  ulong uVar19;
  word *pwVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  
  uVar3 = 1 << ((byte)nVars - 6 & 0x1f);
  uVar11 = 1;
  if (6 < nVars) {
    uVar11 = uVar3;
  }
  uVar10 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar12 = (ulong)(int)uVar11;
    if ((long)pTruth[uVar12 - 1] < 0) goto LAB_004ff88f;
    uVar8 = 0;
  }
  else {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicizePhase::pCopy1 + lVar6) =
           *(undefined8 *)((long)pTruth + lVar6);
      lVar6 = lVar6 + 8;
    } while (uVar10 * 8 - lVar6 != 0);
    uVar12 = uVar10;
    if ((long)pTruth[uVar10 - 1] < 0) {
      uVar4 = 0;
      do {
        pTruth[uVar4] = ~pTruth[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar10 != uVar4);
LAB_004ff88f:
      uVar8 = 1 << ((byte)nVars & 0x1f);
    }
    else {
      uVar8 = 0;
    }
  }
  uVar13 = nVars - 1;
  uVar9 = nVars;
  if (nVars < 7) {
    if (nVars < 1) goto LAB_004ff9db;
  }
  else {
    do {
      uVar14 = uVar13;
      iVar15 = 1 << ((char)uVar9 - 7U & 0x1f);
      if (1 < (int)uVar3) {
        uVar13 = uVar11 - iVar15;
        uVar9 = uVar3;
        do {
          uVar21 = uVar9 - 1;
          uVar4 = (ulong)uVar21;
          if (pTruth[(int)(uVar21 - iVar15)] != pTruth[uVar4]) {
            if (pTruth[(int)(uVar21 - iVar15)] <= pTruth[uVar4]) {
              do {
                uVar22 = (uint)uVar4;
                wVar1 = pTruth[(int)(uVar22 - iVar15)];
                pTruth[(int)(uVar22 - iVar15)] = pTruth[uVar4];
                pTruth[uVar4] = wVar1;
                uVar9 = uVar13 - iVar15;
                uVar21 = uVar9 - iVar15;
                if (uVar22 != uVar13) {
                  uVar9 = uVar22;
                  uVar21 = uVar13;
                }
                uVar13 = uVar21;
                uVar4 = (ulong)(uVar9 - 1);
              } while (1 < (int)uVar9);
              if (uVar9 != 0) {
                __assert_fail("w == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                              ,0x485,"int Abc_TtCanonicizePhaseVar6(word *, int, int)");
              }
              uVar8 = uVar8 ^ 1 << (uVar14 & 0x1f);
            }
            break;
          }
          uVar9 = uVar13 - iVar15;
          uVar22 = uVar9 - iVar15;
          if (uVar21 != uVar13) {
            uVar9 = uVar21;
            uVar22 = uVar13;
          }
          uVar13 = uVar22;
        } while (1 < (int)uVar9);
      }
      uVar13 = uVar14 - 1;
      uVar9 = uVar14;
    } while (6 < (int)uVar14);
    uVar13 = 5;
  }
  uVar4 = (ulong)uVar13;
  do {
    uVar3 = 1 << ((byte)uVar4 & 0x1f);
    uVar7 = s_Truths6[uVar4];
    uVar17 = uVar10;
    do {
      uVar23 = uVar17;
      if ((int)uVar23 < 1) goto LAB_004ff9cf;
      bVar5 = (byte)uVar3;
      uVar19 = pTruth[uVar23 - 1] << (bVar5 & 0x3f) & uVar7;
      uVar16 = pTruth[uVar23 - 1] & uVar7;
      uVar17 = uVar23 - 1;
    } while (uVar19 == uVar16);
    if (uVar19 <= uVar16) {
      uVar17 = uVar23 - 1 & 0xffffffff;
      do {
        pTruth[uVar17] =
             (pTruth[uVar17] & uVar7) >> (bVar5 & 0x3f) | pTruth[uVar17] << (bVar5 & 0x3f) & uVar7;
        uVar17 = uVar17 - 1;
        uVar13 = (int)uVar23 - 1;
        uVar23 = (ulong)uVar13;
      } while (0 < (int)uVar13);
      uVar8 = uVar8 ^ uVar3;
    }
LAB_004ff9cf:
    bVar2 = 0 < (long)uVar4;
    uVar4 = uVar4 - 1;
  } while (bVar2);
LAB_004ff9db:
  if (0 < (int)uVar11) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar6) =
           *(undefined8 *)((long)pTruth + lVar6);
      lVar6 = lVar6 + 8;
    } while (uVar10 * 8 - lVar6 != 0);
    if ((uVar8 >> (nVars & 0x1fU) & 1) != 0) {
      lVar6 = 0;
      do {
        *(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar6) =
             ~*(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar6);
        lVar6 = lVar6 + 8;
      } while (uVar10 * 8 - lVar6 != 0);
    }
  }
  if (0 < nVars) {
    uVar4 = 0;
    do {
      if ((uVar8 >> ((uint)uVar4 & 0x1f) & 1) != 0) {
        bVar5 = (byte)(1 << ((byte)uVar4 & 0x1f));
        if (uVar11 == 1) {
          Abc_TtCanonicizePhase::pCopy2[0] =
               (s_Truths6[uVar4] & Abc_TtCanonicizePhase::pCopy2[0]) >> (bVar5 & 0x3f) |
               Abc_TtCanonicizePhase::pCopy2[0] << (bVar5 & 0x3f) & s_Truths6[uVar4];
        }
        else if (uVar4 < 6) {
          if (0 < (int)uVar11) {
            uVar7 = s_Truths6[uVar4];
            lVar6 = 0;
            do {
              *(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar6) =
                   (*(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar6) & uVar7) >>
                   (bVar5 & 0x3f) |
                   *(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar6) << (bVar5 & 0x3f) & uVar7
              ;
              lVar6 = lVar6 + 8;
            } while (uVar10 * 8 - lVar6 != 0);
          }
        }
        else if (0 < (int)uVar11) {
          bVar5 = (byte)(uVar4 - 6);
          uVar3 = 1 << (bVar5 & 0x1f);
          iVar15 = 2 << (bVar5 & 0x1f);
          uVar7 = 1;
          if (1 < (int)uVar3) {
            uVar7 = (ulong)uVar3;
          }
          pwVar18 = Abc_TtCanonicizePhase::pCopy2 + (int)uVar3;
          pwVar20 = Abc_TtCanonicizePhase::pCopy2;
          do {
            if (uVar4 - 6 != 0x1f) {
              uVar17 = 0;
              do {
                wVar1 = pwVar20[uVar17];
                pwVar20[uVar17] = pwVar18[uVar17];
                pwVar18[uVar17] = wVar1;
                uVar17 = uVar17 + 1;
              } while (uVar7 != uVar17);
            }
            pwVar20 = pwVar20 + iVar15;
            pwVar18 = pwVar18 + iVar15;
          } while (pwVar20 < Abc_TtCanonicizePhase::pCopy2 + uVar12);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nVars);
  }
  if (0 < (int)uVar11) {
    lVar6 = 0;
    do {
      if (*(long *)((long)Abc_TtCanonicizePhase::pCopy1 + lVar6) !=
          *(long *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar6)) {
        puts("Canonical form verification failed!");
        return uVar8;
      }
      lVar6 = lVar6 + 8;
    } while (uVar10 << 3 != lVar6);
  }
  return uVar8;
}

Assistant:

unsigned Abc_TtCanonicizePhase( word * pTruth, int nVars )
{
    unsigned uCanonPhase = 0;
    int v, nWords = Abc_TtWordNum( nVars );
//    static int Counter = 0;
//    Counter++;

#ifdef CANON_VERIFY
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    if ( (pTruth[nWords-1] >> 63) & 1 )
    {
        Abc_TtNot( pTruth, nWords );
        uCanonPhase ^= (1 << nVars);
    }

//    while ( 1 )
//    {
//        unsigned uCanonPhase2 = uCanonPhase;
        for ( v = nVars - 1; v >= 6; v-- )
            if ( Abc_TtCanonicizePhaseVar6( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
        for ( ; v >= 0; v-- )
            if ( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
//        if ( uCanonPhase2 == uCanonPhase )
//            break;
//    }

//    for ( v = 5; v >= 0; v-- )
//        assert( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) != 1 );

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    Abc_TtImplementNpnConfig( pCopy2, nVars, NULL, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
    return uCanonPhase;
}